

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckyRead.c
# Opt level: O3

Abc_TtStore_t * setTtStore(char *pFileInput)

{
  uint uVar1;
  char cVar2;
  char *pcVar3;
  Abc_TtStore_t *pAVar4;
  word **ppwVar5;
  word *pwVar6;
  byte bVar7;
  long lVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  int iVar12;
  uint uVar13;
  long lVar14;
  char *pcVar15;
  byte *pbVar16;
  byte bVar17;
  
  pcVar3 = Abc_FileRead(pFileInput);
  uVar13 = 0;
  uVar10 = 0;
  if (pcVar3 == (char *)0x0) {
LAB_0056b44d:
    pAVar4 = (Abc_TtStore_t *)malloc(0x18);
    pAVar4->nVars = uVar13;
    bVar7 = (char)uVar13 - 6;
    iVar12 = 1 << (bVar7 & 0x1f);
    if (uVar13 < 7) {
      iVar12 = 1;
    }
    pAVar4->nWords = iVar12;
    pAVar4->nFuncs = uVar10;
    bVar17 = 0;
    if (uVar13 >= 7) {
      bVar17 = bVar7;
    }
    ppwVar5 = (word **)malloc((long)(int)uVar10 * 8);
    pAVar4->pFuncs = ppwVar5;
    pwVar6 = (word *)calloc(8,(long)(int)(uVar10 << (bVar17 & 0x1f)));
    *ppwVar5 = pwVar6;
    if (1 < (int)uVar10) {
      pwVar6 = *ppwVar5;
      uVar11 = 1;
      do {
        pwVar6 = pwVar6 + iVar12;
        ppwVar5[uVar11] = pwVar6;
        uVar11 = uVar11 + 1;
      } while (uVar10 != uVar11);
    }
    pcVar3 = Abc_FileRead(pFileInput);
    if (pcVar3 != (char *)0x0) {
      cVar2 = *pcVar3;
      lVar9 = 0;
      if (cVar2 != '\n') {
        uVar1 = 0x10 << (bVar7 & 0x1f);
        if (uVar13 < 7) {
          uVar1 = 1 << ((char)uVar13 - 2U & 0x1f);
        }
        lVar9 = 0;
        lVar14 = 0;
        pcVar15 = pcVar3;
        do {
          if (cVar2 == '0') {
            pcVar15 = pcVar15 + (ulong)(pcVar15[1] == 'x') * 2;
          }
          if ((0x20 < (ulong)(byte)pcVar15[(int)uVar1]) ||
             ((0x100002401U >> ((ulong)(byte)pcVar15[(int)uVar1] & 0x3f) & 1) == 0)) {
            __assert_fail("EndSymbol == \' \' || EndSymbol == \'\\n\' || EndSymbol == \'\\r\' || EndSymbol == \'\\0\'"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/lucky/luckyRead.c"
                          ,0x45,"void Abc_TruthReadHex(word *, char *, int)");
          }
          if (0 < (int)uVar1) {
            pwVar6 = ppwVar5[lVar9];
            pbVar16 = (byte *)(pcVar15 + (long)(int)uVar1 + -1);
            bVar7 = 0;
            uVar11 = 0;
            do {
              bVar17 = *pbVar16;
              iVar12 = -0x30;
              if (9 < (byte)(bVar17 - 0x30)) {
                if ((byte)(bVar17 + 0xbf) < 6) {
                  iVar12 = -0x37;
                }
                else {
                  iVar12 = -0x57;
                  if (5 < (byte)(bVar17 + 0x9f)) {
                    __assert_fail("0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/lucky/luckyRead.c"
                                  ,0x29,"int Abc_TruthReadHexDigit(char)");
                  }
                }
              }
              pwVar6[uVar11 >> 4 & 0xfffffff] =
                   pwVar6[uVar11 >> 4 & 0xfffffff] |
                   (ulong)(iVar12 + (uint)bVar17) << (bVar7 & 0x3c);
              uVar11 = uVar11 + 1;
              bVar7 = bVar7 + 4;
              pbVar16 = pbVar16 + -1;
            } while (uVar1 != uVar11);
          }
          lVar9 = lVar9 + 1;
          lVar8 = lVar14 << 0x20;
          lVar14 = (long)(int)lVar14;
          do {
            pcVar15 = pcVar3 + lVar14;
            lVar14 = lVar14 + 1;
            lVar8 = lVar8 + 0x100000000;
          } while (*pcVar15 != '\n');
          pcVar15 = pcVar3 + (lVar8 >> 0x20);
          cVar2 = pcVar3[lVar8 >> 0x20];
        } while (cVar2 != '\n');
      }
      if ((int)uVar10 < (int)lVar9) {
        __assert_fail("p->nFuncs >= nLines",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/lucky/luckyRead.c"
                      ,0xe8,"void Abc_TruthStoreRead(char *, Abc_TtStore_t *)");
      }
      pAVar4->nFuncs = (int)lVar9;
    }
    return pAVar4;
  }
  uVar11 = 0;
LAB_0056b3c8:
  bVar7 = pcVar3[uVar11];
  if (bVar7 < 0xd) {
    if (bVar7 == 0) {
      puts("Strange, the input file does not have spaces and new-lines...");
LAB_0056b3f8:
      cVar2 = *pcVar3;
      if (cVar2 == '0') {
        uVar10 = (uint)uVar11 - 2;
        if (pcVar3[1] != 'x') {
          uVar10 = (uint)uVar11;
        }
        uVar11 = (ulong)uVar10;
      }
      uVar13 = 0;
      do {
        if ((int)uVar11 << 2 == 1 << ((byte)uVar13 & 0x1f)) {
          if (0xfffffff0 < uVar13 - 0x11) {
            if (cVar2 != '\0') {
              uVar10 = 0;
              do {
                pcVar3 = pcVar3 + 1;
                uVar10 = uVar10 + (cVar2 == '\n');
                cVar2 = *pcVar3;
              } while (cVar2 != '\0');
              goto LAB_0056b44d;
            }
            goto LAB_0056b44b;
          }
          break;
        }
        uVar13 = uVar13 + 1;
      } while (uVar13 != 0x20);
      puts("Does not look like the input file contains truth tables...");
      uVar13 = 0;
LAB_0056b44b:
      uVar10 = 0;
      goto LAB_0056b44d;
    }
    if (bVar7 == 10) goto LAB_0056b3f8;
  }
  else if ((bVar7 == 0xd) || (bVar7 == 0x20)) goto LAB_0056b3f8;
  uVar11 = uVar11 + 1;
  goto LAB_0056b3c8;
}

Assistant:

Abc_TtStore_t * setTtStore(char * pFileInput)
{
    int nVars, nTruths;
    Abc_TtStore_t * p;
    // figure out how many truth table and how many variables
    Abc_TruthGetParams( pFileInput, &nVars, &nTruths );
    // allocate data-structure
    p = Abc_TruthStoreAlloc( nVars, nTruths );

    Abc_TruthStoreRead( pFileInput, p );
    return p;
}